

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::refreshSprites(CGUITabControl *this)

{
  IGUIButton *pIVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar5 != (long *)0x0) {
    bVar2 = (**(code **)(*(long *)this + 0x90))(this);
    uVar3 = (**(code **)*plVar5)(plVar5,(uint)(bVar2 ^ 1) + (uint)(bVar2 ^ 1) * 2 + 0x12);
    pIVar1 = this->UpButton;
    if (pIVar1 != (IGUIButton *)0x0) {
      uVar4 = (**(code **)(*plVar5 + 0x50))(plVar5,7);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar4,(ulong)uVar3,0,0);
      pIVar1 = this->UpButton;
      uVar4 = (**(code **)(*plVar5 + 0x50))(plVar5,7);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar4,(ulong)uVar3,0,0);
    }
    pIVar1 = this->DownButton;
    if (pIVar1 != (IGUIButton *)0x0) {
      uVar4 = (**(code **)(*plVar5 + 0x50))(plVar5,8);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar4,(ulong)uVar3,0,0);
      pIVar1 = this->DownButton;
      uVar4 = (**(code **)(*plVar5 + 0x50))(plVar5,8);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar4,(ulong)uVar3,0,0);
      return;
    }
  }
  return;
}

Assistant:

void CGUITabControl::refreshSprites()
{
	video::SColor color(255, 255, 255, 255);
	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		color = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);

		if (UpButton) {
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_LEFT), color);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_LEFT), color);
		}

		if (DownButton) {
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_RIGHT), color);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_RIGHT), color);
		}
	}
}